

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O0

IAnimatedMesh * __thiscall irr::scene::CSceneManager::getMesh(CSceneManager *this,IReadFile *file)

{
  long *plVar1;
  long *in_RSI;
  string<char> *in_RDI;
  IAnimatedMesh *msh;
  path name;
  string<char> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  IReadFile *in_stack_ffffffffffffffc8;
  CSceneManager *in_stack_ffffffffffffffd0;
  IAnimatedMesh *local_8;
  
  if (in_RSI == (long *)0x0) {
    local_8 = (IAnimatedMesh *)0x0;
  }
  else {
    (**(code **)(*in_RSI + 0x20))();
    core::string<char>::string(in_RDI,in_stack_ffffffffffffffa8);
    plVar1 = *(long **)&in_RDI[0x11].str.field_2;
    local_8 = (IAnimatedMesh *)(**(code **)(*plVar1 + 0x38))(plVar1,&stack0xffffffffffffffc8);
    if (local_8 == (IAnimatedMesh *)0x0) {
      local_8 = getUncachedMesh(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(path *)0x0,
                                (path *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8
                                                ));
    }
    core::string<char>::~string((string<char> *)0x2fa176);
  }
  return local_8;
}

Assistant:

IAnimatedMesh *CSceneManager::getMesh(io::IReadFile *file)
{
	if (!file)
		return 0;

	io::path name = file->getFileName();
	IAnimatedMesh *msh = MeshCache->getMeshByName(name);
	if (msh)
		return msh;

	msh = getUncachedMesh(file, name, name);

	return msh;
}